

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_motion.c
# Opt level: O2

int generic_sad(uint8_t *ref,int ref_stride,uint8_t *dst,int dst_stride,int p_width,int p_height)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  int j;
  ulong uVar7;
  
  uVar6 = 0;
  uVar4 = (ulong)(uint)p_width;
  if (p_width < 1) {
    uVar4 = uVar6;
  }
  uVar5 = (ulong)(uint)p_height;
  if (p_height < 1) {
    uVar5 = uVar6;
  }
  iVar2 = 0;
  for (; uVar6 != uVar5; uVar6 = uVar6 + 1) {
    for (uVar7 = 0; uVar4 != uVar7; uVar7 = uVar7 + 1) {
      uVar3 = (uint)dst[uVar7] - (uint)ref[uVar7];
      uVar1 = -uVar3;
      if (0 < (int)uVar3) {
        uVar1 = uVar3;
      }
      iVar2 = iVar2 + (uVar1 & 0xff);
    }
    ref = ref + ref_stride;
    dst = dst + dst_stride;
  }
  return iVar2;
}

Assistant:

static inline int generic_sad(const uint8_t *const ref, int ref_stride,
                              const uint8_t *const dst, int dst_stride,
                              int p_width, int p_height) {
  // This function should only be called for patches smaller than
  // WARP_ERROR_BLOCK x WARP_ERROR_BLOCK. This keeps the number of pixels
  // small enough that we don't need a 64-bit accumulator
  assert(p_width <= WARP_ERROR_BLOCK && p_height <= WARP_ERROR_BLOCK);

  int sad = 0;
  for (int i = 0; i < p_height; ++i) {
    for (int j = 0; j < p_width; ++j) {
      sad += abs(dst[j + i * dst_stride] - ref[j + i * ref_stride]);
    }
  }
  return sad;
}